

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

Eso_Man_t * Eso_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int Fill;
  Eso_Man_t *pEVar3;
  Vec_Wec_t *p;
  Hsh_VecMan_t *p_00;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_01;
  int c;
  
  pEVar3 = (Eso_Man_t *)calloc(1,0x40);
  pEVar3->pGia = pGia;
  pEVar3->nVars = pGia->vCis->nSize;
  pEVar3->Cube1 = 1000000000;
  p = Vec_WecStart(pGia->nObjs);
  pEVar3->vEsops = p;
  p_00 = (Hsh_VecMan_t *)calloc(1,0x48);
  iVar1 = Abc_PrimeCudd(1000);
  pVVar4 = Vec_IntAlloc(iVar1);
  pVVar4->nSize = iVar1;
  if (pVVar4->pArray != (int *)0x0) {
    memset(pVVar4->pArray,0xff,(long)iVar1 << 2);
  }
  p_00->vTable = pVVar4;
  pVVar4 = Vec_IntAlloc(4000);
  p_00->vData = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p_00->vMap = pVVar4;
  pEVar3->pHash = p_00;
  pVVar5 = Vec_WecStart(pGia->vCis->nSize + 1);
  pEVar3->vCubes = pVVar5;
  pVVar4 = Vec_IntAlloc(pGia->vCis->nSize);
  pEVar3->vCube1 = pVVar4;
  pVVar4 = Vec_IntAlloc(pGia->vCis->nSize);
  pEVar3->vCube2 = pVVar4;
  pVVar4 = Vec_IntAlloc(pGia->vCis->nSize);
  pEVar3->vCube = pVVar4;
  iVar1 = 0;
  while( true ) {
    if (pGia->vCis->nSize <= iVar1) {
      return pEVar3;
    }
    pObj = Gia_ManCi(pGia,iVar1);
    iVar2 = Gia_ObjId(pGia,pObj);
    if (iVar2 == 0) break;
    for (c = 0; c != 2; c = c + 1) {
      Fill = Abc_Var2Lit(iVar1,c);
      Vec_IntFill(pVVar4,1,Fill);
      Hsh_VecManAdd(p_00,pVVar4);
    }
    p_01 = Vec_WecEntry(p,iVar2);
    iVar2 = Abc_Var2Lit(iVar1,0);
    Vec_IntPush(p_01,iVar2);
    iVar1 = iVar1 + 1;
  }
  return pEVar3;
}

Assistant:

Eso_Man_t * Eso_ManAlloc( Gia_Man_t * pGia )
{
    int i, n, Id;
    Eso_Man_t * p = ABC_CALLOC( Eso_Man_t, 1 );
    p->pGia   = pGia;
    p->nVars  = Gia_ManCiNum(pGia);
    p->Cube1  = ABC_INFINITY;
    p->vEsops = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->pHash  = Hsh_VecManStart( 1000 );
    p->vCubes = Vec_WecStart(Gia_ManCiNum(pGia)+1);
    p->vCube1 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube2 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube  = Vec_IntAlloc(Gia_ManCiNum(pGia));
    Gia_ManForEachCiId( pGia, Id, i )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_IntFill( p->vCube, 1, Abc_Var2Lit(i, n) );
            Hsh_VecManAdd( p->pHash, p->vCube );
        }
        Vec_IntPush( Vec_WecEntry(p->vEsops, Id), Abc_Var2Lit(i, 0) );
    }
    return p;
}